

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoods
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int k;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  pdVar4 = this->gPartials[bufferIndex];
  pdVar5 = this->gCategoryWeights[categoryWeightsIndex];
  pdVar6 = this->gStateFrequencies[stateFrequenciesIndex];
  iVar15 = this->kPatternCount;
  if (iVar15 < 1) {
    iVar10 = 0;
  }
  else {
    iVar3 = this->kStateCount;
    pdVar7 = this->integrationTmp;
    iVar12 = 0;
    iVar10 = 0;
    iVar13 = 0;
    do {
      if (0 < iVar3) {
        iVar14 = 0;
        lVar16 = 0;
        do {
          *(double *)((long)pdVar7 + lVar16 + (long)iVar13 * 8) =
               *(double *)((long)pdVar4 + lVar16 + (long)iVar10 * 8) * *pdVar5;
          lVar16 = lVar16 + 8;
          iVar14 = iVar14 + -1;
        } while (-iVar3 != iVar14);
        iVar13 = iVar13 - iVar14;
        iVar10 = iVar10 - iVar14;
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar15);
  }
  iVar3 = this->kCategoryCount;
  if (1 < (long)iVar3) {
    iVar12 = this->kStateCount;
    lVar16 = 1;
    do {
      if (0 < iVar15) {
        pdVar7 = this->integrationTmp;
        iVar13 = 0;
        iVar14 = 0;
        do {
          if (0 < iVar12) {
            iVar9 = 0;
            lVar17 = 0;
            do {
              auVar19._8_8_ = 0;
              auVar19._0_8_ = *(ulong *)((long)pdVar4 + lVar17 + (long)iVar10 * 8);
              auVar22._8_8_ = 0;
              auVar22._0_8_ = pdVar5[lVar16];
              auVar20._8_8_ = 0;
              auVar20._0_8_ = *(ulong *)((long)pdVar7 + lVar17 + (long)iVar14 * 8);
              auVar20 = vfmadd213sd_fma(auVar22,auVar19,auVar20);
              *(long *)((long)pdVar7 + lVar17 + (long)iVar14 * 8) = auVar20._0_8_;
              lVar17 = lVar17 + 8;
              iVar9 = iVar9 + -1;
            } while (-iVar12 != iVar9);
            iVar14 = iVar14 - iVar9;
            iVar10 = iVar10 - iVar9;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 != iVar15);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != iVar3);
  }
  uVar8 = (ulong)(uint)this->kPatternCount;
  if (0 < this->kPatternCount) {
    lVar16 = 0;
    iVar15 = 0;
    do {
      iVar10 = this->kStateCount;
      if ((long)iVar10 < 1) {
        dVar18 = 0.0;
      }
      else {
        auVar20 = ZEXT816(0);
        lVar17 = 0;
        do {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = pdVar6[lVar17];
          auVar1._8_8_ = 0;
          auVar1._0_8_ = this->integrationTmp[iVar15 + lVar17];
          auVar20 = vfmadd231sd_fma(auVar20,auVar23,auVar1);
          dVar18 = auVar20._0_8_;
          lVar17 = lVar17 + 1;
        } while (iVar10 != lVar17);
        iVar15 = iVar15 + iVar10;
      }
      dVar18 = log(dVar18);
      this->outLogLikelihoodsTmp[lVar16] = dVar18;
      lVar16 = lVar16 + 1;
      uVar8 = (ulong)this->kPatternCount;
    } while (lVar16 < (long)uVar8);
  }
  if ((-1 < scalingFactorsIndex) && (0 < (int)uVar8)) {
    pdVar4 = this->gScaleBuffers[(uint)scalingFactorsIndex];
    pdVar5 = this->outLogLikelihoodsTmp;
    uVar11 = 0;
    do {
      pdVar5[uVar11] = pdVar4[uVar11] + pdVar5[uVar11];
      uVar11 = uVar11 + 1;
    } while ((uVar8 & 0xffffffff) != uVar11);
  }
  *outSumLogLikelihood = 0.0;
  if (0 < (int)uVar8) {
    pdVar4 = this->gPatternWeights;
    pdVar5 = this->outLogLikelihoodsTmp;
    auVar21 = ZEXT864((ulong)*outSumLogLikelihood);
    uVar11 = 0;
    do {
      auVar24._8_8_ = 0;
      auVar24._0_8_ = pdVar5[uVar11];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pdVar4[uVar11];
      auVar20 = vfmadd231sd_fma(auVar21._0_16_,auVar24,auVar2);
      auVar21 = ZEXT1664(auVar20);
      *outSumLogLikelihood = auVar20._0_8_;
      uVar11 = uVar11 + 1;
    } while ((uVar8 & 0xffffffff) != uVar11);
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                            const int categoryWeightsIndex,
                            const int stateFrequenciesIndex,
                            const int scalingFactorsIndex,
                            double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];
    int u = 0;
    int v = 0;
    for (int k = 0; k < kPatternCount; k++) {
        for (int i = 0; i < kStateCount; i++) {
            integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
            u++;
            v++;
        }
        v += P_PAD;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                u++;
                v++;
            }
            v += P_PAD;
        }
    }
    u = 0;
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE sum = 0.0;
        for (int i = 0; i < kStateCount; i++) {
            sum += freqs[i] * integrationTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sum);
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        for(int i=0; i<kPatternCount; i++) {
            outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
        }
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    // TODO: merge the three kPatternCount loops above into one

    return returnCode;
}